

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O2

void __thiscall Firework::applyForce(Firework *this,vec2 force)

{
  anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
  aVar1;
  Particle *pPVar2;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aVar3;
  float fVar4;
  Particle *particle;
  Particle *this_00;
  
  if (this->exploded != false) {
    pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl
                   .super__Vector_impl_data._M_start; this_00 != pPVar2; this_00 = this_00 + 1) {
      Particle::applyForce(this_00,force);
    }
    return;
  }
  fVar4 = (this->rocket).mass;
  aVar1 = (this->rocket).acceleration.field_0.field_0;
  aVar3.field_0.y = aVar1.y + fVar4 * force.field_0._4_4_;
  aVar3.field_0.x = aVar1.x + fVar4 * force.field_0._0_4_;
  (this->rocket).acceleration.field_0 = aVar3;
  return;
}

Assistant:

void Firework::applyForce(glm::vec2 force) {
    if (!exploded) {
        rocket.applyForce(force);
    } else {
        for (Particle& particle : particles) {
            particle.applyForce(force);
        }
    }
}